

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_loshelf2_config *
ma_loshelf2_config_init
          (ma_format format,ma_uint32 channels,ma_uint32 sampleRate,double gainDB,double shelfSlope,
          double frequency)

{
  ma_loshelf2_config *in_RDI;
  
  if (in_RDI != (ma_loshelf2_config *)0x0) {
    *(undefined8 *)&in_RDI->sampleRate = 0;
  }
  in_RDI->format = format;
  in_RDI->channels = channels;
  in_RDI->sampleRate = sampleRate;
  in_RDI->gainDB = gainDB;
  in_RDI->shelfSlope = shelfSlope;
  in_RDI->frequency = frequency;
  return in_RDI;
}

Assistant:

MA_API ma_loshelf2_config ma_loshelf2_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double gainDB, double shelfSlope, double frequency)
{
    ma_loshelf2_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;
    config.gainDB     = gainDB;
    config.shelfSlope = shelfSlope;
    config.frequency  = frequency;

    return config;
}